

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O3

UChar * res_getString_63(ResourceData *pResData,Resource res,int32_t *pLength)

{
  UChar UVar1;
  int iVar2;
  uint uVar3;
  uint16_t **ppuVar4;
  anon_struct_8_3_a62c8074 *s;
  
  if ((res & 0xf0000000) == 0x60000000) {
    ppuVar4 = &pResData->poolBundleStrings;
    iVar2 = 0;
    if (pResData->poolStringIndexLimit <= (int)(res & 0xfffffff)) {
      ppuVar4 = &pResData->p16BitUnits;
      iVar2 = pResData->poolStringIndexLimit;
    }
    s = (anon_struct_8_3_a62c8074 *)(*ppuVar4 + ((res & 0xfffffff) - iVar2));
    UVar1 = *(UChar *)&s->length;
    if ((UVar1 & 0xfc00U) != 0xdc00) {
      uVar3 = u_strlen_63((UChar *)s);
      goto LAB_001af759;
    }
    if ((ushort)UVar1 < 0xdfef) {
      uVar3 = (ushort)UVar1 & 0x3ff;
      s = (anon_struct_8_3_a62c8074 *)((long)&s->length + 2);
      goto LAB_001af759;
    }
    if (0xdffe < (ushort)UVar1) {
      uVar3 = CONCAT22(*(UChar *)((long)&s->length + 2),s->nul);
      s = (anon_struct_8_3_a62c8074 *)&s->pad;
      goto LAB_001af759;
    }
    uVar3 = (uint)(ushort)UVar1 * 0x10000 + (uint)(ushort)*(UChar *)((long)&s->length + 2) +
            0x20110000;
  }
  else {
    if (0xfffffff < res) {
      uVar3 = 0;
      s = (anon_struct_8_3_a62c8074 *)0x0;
      goto LAB_001af759;
    }
    if (res == 0) {
      s = &gEmptyString;
    }
    else {
      s = (anon_struct_8_3_a62c8074 *)(pResData->pRoot + res);
    }
    uVar3 = s->length;
  }
  s = (anon_struct_8_3_a62c8074 *)&s->nul;
LAB_001af759:
  if (pLength != (int32_t *)0x0) {
    *pLength = uVar3;
  }
  return (UChar *)s;
}

Assistant:

U_CAPI const UChar * U_EXPORT2
res_getString(const ResourceData *pResData, Resource res, int32_t *pLength) {
    const UChar *p;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length;
    if(RES_GET_TYPE(res)==URES_STRING_V2) {
        int32_t first;
        if((int32_t)offset<pResData->poolStringIndexLimit) {
            p=(const UChar *)pResData->poolBundleStrings+offset;
        } else {
            p=(const UChar *)pResData->p16BitUnits+(offset-pResData->poolStringIndexLimit);
        }
        first=*p;
        if(!U16_IS_TRAIL(first)) {
            length=u_strlen(p);
        } else if(first<0xdfef) {
            length=first&0x3ff;
            ++p;
        } else if(first<0xdfff) {
            length=((first-0xdfef)<<16)|p[1];
            p+=2;
        } else {
            length=((int32_t)p[1]<<16)|p[2];
            p+=3;
        }
    } else if(res==offset) /* RES_GET_TYPE(res)==URES_STRING */ {
        const int32_t *p32= res==0 ? &gEmptyString.length : pResData->pRoot+res;
        length=*p32++;
        p=(const UChar *)p32;
    } else {
        p=NULL;
        length=0;
    }
    if(pLength) {
        *pLength=length;
    }
    return p;
}